

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void minmaxFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  void *pvVar1;
  CollSeq *pColl;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  pvVar1 = context->pFunc->pUserData;
  if ((*argv)->type != '\x05') {
    pColl = context->pColl;
    uVar4 = 1;
    while( true ) {
      if ((long)argc <= (long)uVar4) {
        sqlite3VdbeMemCopy(&context->s,argv[(int)uVar3]);
        return;
      }
      if (argv[uVar4]->type == '\x05') break;
      uVar2 = sqlite3MemCompare(argv[(int)uVar3],argv[uVar4],pColl);
      if (-1 < (int)(uVar2 ^ -(uint)(pvVar1 != (void *)0x0))) {
        uVar3 = uVar4 & 0xffffffff;
      }
      uVar4 = uVar4 + 1;
    }
  }
  return;
}

Assistant:

static void minmaxFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i;
  int mask;    /* 0 for min() or 0xffffffff for max() */
  int iBest;
  CollSeq *pColl;

  assert( argc>1 );
  mask = sqlite3_user_data(context)==0 ? 0 : -1;
  pColl = sqlite3GetFuncCollSeq(context);
  assert( pColl );
  assert( mask==-1 || mask==0 );
  iBest = 0;
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  for(i=1; i<argc; i++){
    if( sqlite3_value_type(argv[i])==SQLITE_NULL ) return;
    if( (sqlite3MemCompare(argv[iBest], argv[i], pColl)^mask)>=0 ){
      testcase( mask==0 );
      iBest = i;
    }
  }
  sqlite3_result_value(context, argv[iBest]);
}